

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O0

bool __thiscall Pig::getUntil(Pig *this,int end,string *result)

{
  bool bVar1;
  element_type *peVar2;
  string local_80 [32];
  string local_60 [32];
  size_type local_40;
  size_type prev;
  size_type sStack_30;
  int c;
  size_type save;
  string *result_local;
  Pig *pPStack_18;
  int end_local;
  Pig *this_local;
  
  sStack_30 = this->_cursor;
  local_40 = this->_cursor;
  save = (size_type)result;
  result_local._4_4_ = end;
  pPStack_18 = this;
  while( true ) {
    peVar2 = std::
             __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    prev._4_4_ = utf8_next_char(peVar2,&this->_cursor);
    if (prev._4_4_ == 0) {
      return sStack_30 < this->_cursor;
    }
    if (prev._4_4_ == result_local._4_4_) break;
    bVar1 = eos(this);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::substr((ulong)local_80,(ulong)peVar2);
      std::__cxx11::string::operator=((string *)save,local_80);
      std::__cxx11::string::~string(local_80);
      return true;
    }
    local_40 = this->_cursor;
  }
  this->_cursor = local_40;
  peVar2 = std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__cxx11::string::substr((ulong)local_60,(ulong)peVar2);
  std::__cxx11::string::operator=((string *)save,local_60);
  std::__cxx11::string::~string(local_60);
  return true;
}

Assistant:

bool Pig::getUntil (int end, std::string& result)
{
  auto save = _cursor;

  int c;
  auto prev = _cursor;
  while ((c = utf8_next_char (*_text, _cursor)))
  {
    if (c == end)
    {
      _cursor = prev;
      result = _text->substr (save, _cursor - save);
      return true;
    }

    else if (eos ())
    {
      result = _text->substr (save, _cursor - save);
      return true;
    }

    prev = _cursor;
  }

  return _cursor > save;
}